

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

DotInterpretation units::findDotInterpretation(string *unit_string)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  DotInterpretation dInt;
  size_type dloc;
  size_type in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  size_type local_18;
  DotInterpretation local_1;
  
  local_18 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                           (char)(in_stack_ffffffffffffffd8 >> 0x38),0x6ca13c);
  if (local_18 == 0xffffffffffffffff) {
    local_1 = none;
  }
  else {
    local_1 = none;
    while (local_18 != 0xffffffffffffffff) {
      if (local_18 == 0) {
        sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(in_RDI);
        if (1 < sVar3) {
          pvVar2 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(local_1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8)
          ;
          bVar1 = isDigitCharacter(*pvVar2);
          if (!bVar1) {
            local_1 = multiply;
          }
        }
      }
      else {
        pvVar2 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(local_1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
        bVar1 = isDigitCharacter(*pvVar2);
        if (bVar1) {
          pvVar2 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(local_1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8)
          ;
          bVar1 = isDigitCharacter(*pvVar2);
          if (bVar1) goto LAB_006ca259;
        }
        pvVar2 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(local_1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
        if ((*pvVar2 == '*') ||
           (pvVar2 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(local_1,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffd8), *pvVar2 == ' ')) {
          return abbrev;
        }
        sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(in_RDI);
        if (local_18 == sVar3 - 1) {
          return abbrev;
        }
        local_1 = multiply;
        in_stack_ffffffffffffffd8 = local_18;
      }
LAB_006ca259:
      local_18 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(local_1,in_stack_ffffffffffffffe0),
                            (char)(in_stack_ffffffffffffffd8 >> 0x38),0x6ca271);
    }
  }
  return local_1;
}

Assistant:

static DotInterpretation findDotInterpretation(const std::string& unit_string)
{
    auto dloc = unit_string.find_first_of('.');
    if (dloc == std::string::npos) {
        // LCOV_EXCL_START
        // in all internal contexts this function wouldn't be called if there
        // was no dots
        return DotInterpretation::none;
        // LCOV_EXCL_STOP
    }
    DotInterpretation dInt{DotInterpretation::none};
    while (dloc != std::string::npos) {
        if (dloc > 0) {
            if (!isDigitCharacter(unit_string[dloc - 1]) ||
                !isDigitCharacter(unit_string[dloc + 1])) {
                if (unit_string[dloc - 1] == '*' ||
                    unit_string[dloc + 1] == ' ') {
                    return DotInterpretation::abbrev;
                }
                if (dloc == unit_string.size() - 1) {
                    return DotInterpretation::abbrev;
                }
                dInt = DotInterpretation::multiply;
            }
        } else if (unit_string.size() > 1) {
            if (!isDigitCharacter(unit_string[dloc + 1])) {
                dInt = DotInterpretation::multiply;
            }
        }
        dloc = unit_string.find_first_of('.', dloc + 1);
    }
    return dInt;
}